

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O3

void __thiscall
google::
dense_hashtable<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
::clear_to_size(dense_hashtable<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
                *this,size_type new_num_buckets)

{
  pointer ptr;
  int *piVar1;
  ulong uVar2;
  size_type sVar3;
  float fVar4;
  
  ptr = this->table;
  if (ptr == (pointer)0x0) {
    ptr = (pointer)malloc(new_num_buckets * 0xc);
  }
  else {
    if (this->num_buckets == new_num_buckets) goto LAB_00130d11;
    ptr = alloc_impl<google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
          ::realloc_or_die((alloc_impl<google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
                            *)&this->field_0x48,ptr,new_num_buckets);
  }
  this->table = ptr;
LAB_00130d11:
  if (new_num_buckets != 0) {
    piVar1 = &ptr->second;
    sVar3 = new_num_buckets;
    do {
      (((pair<const_HashObject<8,_8>,_int> *)(piVar1 + -2))->first).i_ =
           (this->key_info).empty_key.i_;
      piVar1[-1] = *(undefined4 *)(this->key_info).empty_key.buffer_;
      *piVar1 = 0;
      piVar1 = piVar1 + 3;
      sVar3 = sVar3 - 1;
    } while (sVar3 != 0);
    g_num_copies = g_num_copies + (int)new_num_buckets;
  }
  this->num_deleted = 0;
  this->num_elements = 0;
  this->num_buckets = new_num_buckets;
  fVar4 = (this->settings).super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
          enlarge_factor_ * (float)new_num_buckets;
  uVar2 = (ulong)fVar4;
  (this->settings).super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
  enlarge_threshold_ = (long)(fVar4 - 9.223372e+18) & (long)uVar2 >> 0x3f | uVar2;
  fVar4 = (float)new_num_buckets *
          (this->settings).super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
          shrink_factor_;
  uVar2 = (ulong)fVar4;
  (this->settings).super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
  shrink_threshold_ = (long)(fVar4 - 9.223372e+18) & (long)uVar2 >> 0x3f | uVar2;
  (this->settings).super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
  consider_shrink_ = false;
  return;
}

Assistant:

void clear_to_size(size_type new_num_buckets) {
    if (!table) {
      table = val_info.allocate(new_num_buckets);
    } else {
      destroy_buckets(0, num_buckets);
      if (new_num_buckets != num_buckets) {  // resize, if necessary
        typedef std::integral_constant<
            bool, std::is_same<value_alloc_type,
                               libc_allocator_with_realloc<value_type>>::value>
            realloc_ok;
        resize_table(num_buckets, new_num_buckets, realloc_ok());
      }
    }
    assert(table);
    fill_range_with_empty(table, new_num_buckets);
    num_elements = 0;
    num_deleted = 0;
    num_buckets = new_num_buckets;  // our new size
    settings.reset_thresholds(bucket_count());
  }